

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

void __thiscall
Protocol::MQTT::V5::Property<unsigned_short>::dump
          (Property<unsigned_short> *this,FastString *out,int indent)

{
  char *pcVar1;
  unsigned_short *puVar2;
  String local_50 [2];
  String local_30;
  int local_1c;
  FastString *pFStack_18;
  int indent_local;
  FastString *out_local;
  Property<unsigned_short> *this_local;
  
  local_1c = indent;
  pFStack_18 = out;
  out_local = (FastString *)this;
  pcVar1 = PrivateRegistry::getPropertyName((this->super_PropertyBaseImpl).super_PropertyBase.type);
  MQTTStringPrintf((char *)&local_30,"%*sType %s\n",(ulong)(uint)indent,"",pcVar1);
  Bstrlib::String::operator+=(pFStack_18,&local_30);
  Bstrlib::String::~String(&local_30);
  MQTTStringPrintf((char *)local_50,"%*s",(ulong)(local_1c + 2),"");
  Bstrlib::String::operator+=(pFStack_18,local_50);
  Bstrlib::String::~String(local_50);
  puVar2 = GenericType::operator_cast_to_unsigned_short_((GenericType *)&this->value);
  Bstrlib::String::operator+=(pFStack_18,(uint)*puVar2);
  Bstrlib::String::operator+=(pFStack_18,"\n");
  return;
}

Assistant:

void dump(MQTTString & out, const int indent = 0)
                {
                    out += MQTTStringPrintf("%*sType %s\n", indent, "", PrivateRegistry::getPropertyName(type));
                    out += MQTTStringPrintf("%*s", indent+2, ""); out += (T)value; out += "\n";
                }